

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void __thiscall polyscope::Histogram::renderToTexture(Histogram *this)

{
  double dVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->currBufferWeighted != this->useWeighted) ||
     (this->currBufferSmoothed != this->useSmoothed)) {
    fillBuffers(this);
  }
  peVar2 = (this->framebuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->clearColor).field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0
  ;
  (peVar2->clearColor).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0
  ;
  (peVar2->clearColor).field_2.z = 0.0;
  peVar2 = (this->framebuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->clearAlpha = 0.2;
  (*peVar2->_vptr_FrameBuffer[10])(peVar2,0,0,(ulong)this->texDim,(ulong)this->texDim);
  (*((this->framebuffer).
     super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FrameBuffer[3])();
  (*((this->framebuffer).
     super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FrameBuffer[4])();
  peVar3 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"u_cmapRangeMin","");
  dVar1 = (this->dataRange).first;
  (*peVar3->_vptr_ShaderProgram[6])
            (((this->colormapRange).first - dVar1) / ((this->dataRange).second - dVar1),peVar3,
             (string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  peVar3 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"u_cmapRangeMax","");
  dVar1 = (this->dataRange).first;
  (*peVar3->_vptr_ShaderProgram[6])
            (((this->colormapRange).second - dVar1) / ((this->dataRange).second - dVar1),peVar3,
             (string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  (*((this->program).
     super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ShaderProgram[0x1e])();
  return;
}

Assistant:

void Histogram::renderToTexture() {

  // Refill buffer if needed
  if (currBufferWeighted != useWeighted || currBufferSmoothed != useSmoothed) {
    fillBuffers();
  }

  framebuffer->clearColor = {0.0, 0.0, 0.0};
  framebuffer->clearAlpha = 0.2;
  framebuffer->setViewport(0, 0, texDim, texDim);
  framebuffer->bindForRendering();
  framebuffer->clear();

  // = Set uniforms

  // Colormap range (remapped to the 0-1 coords we use)
  program->setUniform("u_cmapRangeMin", (colormapRange.first - dataRange.first) / (dataRange.second - dataRange.first));
  program->setUniform("u_cmapRangeMax",
                      (colormapRange.second - dataRange.first) / (dataRange.second - dataRange.first));

  // Draw
  program->draw();
}